

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeSetStringSpan::UnicodeSetStringSpan
          (UnicodeSetStringSpan *this,UnicodeSet *set,UVector *setStrings,uint32_t which)

{
  UnicodeSet *this_00;
  short sVar1;
  bool bVar2;
  char cVar3;
  uint8_t uVar4;
  int32_t iVar5;
  int iVar6;
  UnicodeString *pUVar7;
  char16_t *pcVar8;
  int32_t *piVar9;
  undefined1 uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int32_t iVar14;
  uint8_t *t;
  int local_74;
  int32_t *local_68;
  int32_t *local_60;
  int32_t local_58;
  UErrorCode errorCode;
  int32_t *local_50;
  int32_t **local_48;
  ulong local_40;
  long local_38;
  
  this_00 = &this->spanSet;
  UnicodeSet::UnicodeSet(this_00,0,0x10ffff);
  this->pSpanNotSet = (UnicodeSet *)0x0;
  this->strings = setStrings;
  this->maxLength8 = 0;
  this->utf8Lengths = (int32_t *)0x0;
  this->spanLengths = (uint8_t *)0x0;
  this->utf8 = (uint8_t *)0x0;
  this->utf8Length = 0;
  this->maxLength16 = 0;
  this->all = which == 0x3f;
  UnicodeSet::retainAll(this_00,set);
  if ((which & 1) != 0) {
    this->pSpanNotSet = this_00;
  }
  local_48 = &this->utf8Lengths;
  uVar12 = this->strings->count;
  local_40 = (ulong)uVar12;
  local_38 = (long)(int)uVar12;
  bVar2 = false;
  uVar11 = 0;
  if (0 < (int)uVar12) {
    uVar11 = uVar12;
  }
  for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    pUVar7 = (UnicodeString *)UVector::elementAt(this->strings,uVar12);
    pcVar8 = UnicodeString::getBuffer(pUVar7);
    sVar1 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar14 = (pUVar7->fUnion).fFields.fLength;
    }
    else {
      iVar14 = (int)sVar1 >> 5;
    }
    iVar5 = UnicodeSet::span(this_00,pcVar8,iVar14,USET_SPAN_CONTAINED);
    if (iVar5 < iVar14) {
      bVar2 = true;
    }
    if (((which & 8) != 0) && (this->maxLength16 < iVar14)) {
      this->maxLength16 = iVar14;
    }
    if (((which & 4) != 0) && ((which & 2) != 0 || iVar5 < iVar14)) {
      errorCode = U_ZERO_ERROR;
      local_58 = 0;
      u_strToUTF8_63((char *)0x0,0,&local_58,pcVar8,iVar14,&errorCode);
      iVar6 = 0;
      if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
        iVar6 = local_58;
      }
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar6 = local_58;
      }
      this->utf8Length = this->utf8Length + iVar6;
      if (this->maxLength8 < iVar6) {
        this->maxLength8 = iVar6;
      }
    }
  }
  if (bVar2) {
    uVar12 = (uint)local_40;
    if (this->all == '\0') {
LAB_002b35a1:
      if ((which & 4) != 0) {
        uVar12 = uVar12 * 5 + this->utf8Length;
      }
      cVar3 = '\0';
    }
    else {
      UnicodeSet::freeze(this_00);
      cVar3 = this->all;
      if (cVar3 == '\0') goto LAB_002b35a1;
      uVar12 = uVar12 * 8 + this->utf8Length;
    }
    if ((int)uVar12 < 0x81) {
      local_68 = this->staticLengths;
      this->utf8Lengths = local_68;
    }
    else {
      local_68 = (int32_t *)uprv_malloc_63((ulong)uVar12);
      *local_48 = local_68;
      if (local_68 == (int32_t *)0x0) goto LAB_002b361b;
      cVar3 = this->all;
    }
    if (cVar3 == '\0') {
      if ((which & 4) != 0) {
        local_68 = local_68 + local_38;
        this->utf8 = (uint8_t *)(local_38 + (long)local_68);
      }
      this->spanLengths = (uint8_t *)local_68;
      local_60 = local_68;
      local_50 = local_68;
    }
    else {
      this->spanLengths = (uint8_t *)(local_68 + local_38);
      local_50 = (int32_t *)((long)(local_68 + local_38) + local_38);
      local_68 = (int32_t *)((long)local_50 + local_38);
      local_60 = (int32_t *)((long)local_68 + local_38);
      this->utf8 = (uint8_t *)(local_38 + (long)local_60);
    }
    local_40 = (ulong)uVar11;
    local_74 = 0;
    for (uVar13 = 0; local_40 != uVar13; uVar13 = uVar13 + 1) {
      pUVar7 = (UnicodeString *)UVector::elementAt(this->strings,(int32_t)uVar13);
      pcVar8 = UnicodeString::getBuffer(pUVar7);
      sVar1 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar12 = (pUVar7->fUnion).fFields.fLength;
      }
      else {
        uVar12 = (int)sVar1 >> 5;
      }
      iVar14 = UnicodeSet::span(this_00,pcVar8,uVar12,USET_SPAN_CONTAINED);
      if (iVar14 < (int)uVar12) {
        if ((which & 8) != 0) {
          if ((which & 2) == 0) {
            *(undefined1 *)((long)local_50 + uVar13) = 0;
            uVar10 = 0;
            piVar9 = (int32_t *)this->spanLengths;
          }
          else {
            if ((which & 0x20) != 0) {
              uVar4 = (uint8_t)iVar14;
              if (0xfd < iVar14) {
                uVar4 = 0xfe;
              }
              this->spanLengths[uVar13] = uVar4;
            }
            if ((which & 0x10) == 0) goto LAB_002b375a;
            iVar14 = UnicodeSet::spanBack(this_00,pcVar8,uVar12,USET_SPAN_CONTAINED);
            iVar6 = uVar12 - iVar14;
            if (0xfd < (int)(uVar12 - iVar14)) {
              iVar6 = 0xfe;
            }
            uVar10 = (undefined1)iVar6;
            piVar9 = local_50;
          }
          *(undefined1 *)((long)piVar9 + uVar13) = uVar10;
        }
LAB_002b375a:
        if ((which & 4) != 0) {
          t = this->utf8 + local_74;
          iVar14 = appendUTF8(pcVar8,uVar12,t,this->utf8Length - local_74);
          (*local_48)[uVar13] = iVar14;
          local_74 = local_74 + iVar14;
          piVar9 = local_68;
          if (iVar14 == 0) {
            *(undefined1 *)((long)local_60 + uVar13) = 0xff;
            uVar10 = 0xff;
          }
          else if ((which & 2) == 0) {
            *(undefined1 *)((long)local_60 + uVar13) = 0;
            uVar10 = 0;
          }
          else {
            if ((which & 0x20) != 0) {
              iVar5 = UnicodeSet::spanUTF8(this_00,(char *)t,iVar14,USET_SPAN_CONTAINED);
              uVar10 = (undefined1)iVar5;
              if (0xfd < iVar5) {
                uVar10 = 0xfe;
              }
              *(undefined1 *)((long)local_68 + uVar13) = uVar10;
            }
            if ((which & 0x10) == 0) goto LAB_002b3843;
            iVar5 = UnicodeSet::spanBackUTF8(this_00,(char *)t,iVar14,USET_SPAN_CONTAINED);
            iVar6 = iVar14 - iVar5;
            if (0xfd < iVar14 - iVar5) {
              iVar6 = 0xfe;
            }
            uVar10 = (undefined1)iVar6;
            piVar9 = local_60;
          }
          *(undefined1 *)((long)piVar9 + uVar13) = uVar10;
        }
LAB_002b3843:
        if ((which & 1) != 0) {
          if ((which & 0x20) != 0) {
            uVar11 = (uint)(ushort)*pcVar8;
            if ((uVar12 != 1 && (uVar11 & 0xfc00) == 0xd800) &&
               (((ushort)pcVar8[1] & 0xfc00) == 0xdc00)) {
              uVar11 = (uint)(ushort)*pcVar8 * 0x400 + (uint)(ushort)pcVar8[1] + 0xfca02400;
            }
            addToSpanNotSet(this,uVar11);
          }
          if ((which & 0x10) != 0) {
            uVar11 = (uint)(ushort)pcVar8[(long)(int)uVar12 + -1];
            if (((1 < (int)uVar12) && ((uVar11 & 0xfc00) == 0xdc00)) &&
               ((pcVar8[(ulong)uVar12 - 2] & 0xfc00U) == 0xd800)) {
              uVar11 = (uint)(ushort)pcVar8[(long)(int)uVar12 + -1] +
                       (uint)(ushort)pcVar8[(ulong)uVar12 - 2] * 0x400 + 0xfca02400;
            }
            addToSpanNotSet(this,uVar11);
          }
        }
      }
      else {
        if ((which & 4) != 0) {
          if ((which & 2) == 0) {
            (*local_48)[uVar13] = 0;
          }
          else {
            iVar14 = appendUTF8(pcVar8,uVar12,this->utf8 + local_74,this->utf8Length - local_74);
            (*local_48)[uVar13] = iVar14;
            local_74 = local_74 + iVar14;
          }
        }
        if (this->all != '\0') {
          *(undefined1 *)((long)local_60 + uVar13) = 0xff;
          *(undefined1 *)((long)local_68 + uVar13) = 0xff;
          *(undefined1 *)((long)local_50 + uVar13) = 0xff;
        }
        this->spanLengths[uVar13] = 0xff;
      }
    }
    if (this->all != '\0') {
      UnicodeSet::freeze(this->pSpanNotSet);
    }
  }
  else {
LAB_002b361b:
    this->maxLength16 = 0;
    this->maxLength8 = 0;
  }
  return;
}

Assistant:

UnicodeSetStringSpan::UnicodeSetStringSpan(const UnicodeSet &set,
                                           const UVector &setStrings,
                                           uint32_t which)
        : spanSet(0, 0x10ffff), pSpanNotSet(NULL), strings(setStrings),
          utf8Lengths(NULL), spanLengths(NULL), utf8(NULL),
          utf8Length(0),
          maxLength16(0), maxLength8(0),
          all((UBool)(which==ALL)) {
    spanSet.retainAll(set);
    if(which&NOT_CONTAINED) {
        // Default to the same sets.
        // addToSpanNotSet() will create a separate set if necessary.
        pSpanNotSet=&spanSet;
    }

    // Determine if the strings even need to be taken into account at all for span() etc.
    // If any string is relevant, then all strings need to be used for
    // span(longest match) but only the relevant ones for span(while contained).
    // TODO: Possible optimization: Distinguish CONTAINED vs. LONGEST_MATCH
    //   and do not store UTF-8 strings if !thisRelevant and CONTAINED.
    //   (Only store irrelevant UTF-8 strings for LONGEST_MATCH where they are relevant after all.)
    // Also count the lengths of the UTF-8 versions of the strings for memory allocation.
    int32_t stringsLength=strings.size();

    int32_t i, spanLength;
    UBool someRelevant=FALSE;
    for(i=0; i<stringsLength; ++i) {
        const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
        const UChar *s16=string.getBuffer();
        int32_t length16=string.length();
        UBool thisRelevant;
        spanLength=spanSet.span(s16, length16, USET_SPAN_CONTAINED);
        if(spanLength<length16) {  // Relevant string.
            someRelevant=thisRelevant=TRUE;
        } else {
            thisRelevant=FALSE;
        }
        if((which&UTF16) && length16>maxLength16) {
            maxLength16=length16;
        }
        if((which&UTF8) && (thisRelevant || (which&CONTAINED))) {
            int32_t length8=getUTF8Length(s16, length16);
            utf8Length+=length8;
            if(length8>maxLength8) {
                maxLength8=length8;
            }
        }
    }
    if(!someRelevant) {
        maxLength16=maxLength8=0;
        return;
    }

    // Freeze after checking for the need to use strings at all because freezing
    // a set takes some time and memory which are wasted if there are no relevant strings.
    if(all) {
        spanSet.freeze();
    }

    uint8_t *spanBackLengths;
    uint8_t *spanUTF8Lengths;
    uint8_t *spanBackUTF8Lengths;

    // Allocate a block of meta data.
    int32_t allocSize;
    if(all) {
        // UTF-8 lengths, 4 sets of span lengths, UTF-8 strings.
        allocSize=stringsLength*(4+1+1+1+1)+utf8Length;
    } else {
        allocSize=stringsLength;  // One set of span lengths.
        if(which&UTF8) {
            // UTF-8 lengths and UTF-8 strings.
            allocSize+=stringsLength*4+utf8Length;
        }
    }
    if(allocSize<=(int32_t)sizeof(staticLengths)) {
        utf8Lengths=staticLengths;
    } else {
        utf8Lengths=(int32_t *)uprv_malloc(allocSize);
        if(utf8Lengths==NULL) {
            maxLength16=maxLength8=0;  // Prevent usage by making needsStringSpanUTF16/8() return FALSE.
            return;  // Out of memory.
        }
    }

    if(all) {
        // Store span lengths for all span() variants.
        spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
        spanBackLengths=spanLengths+stringsLength;
        spanUTF8Lengths=spanBackLengths+stringsLength;
        spanBackUTF8Lengths=spanUTF8Lengths+stringsLength;
        utf8=spanBackUTF8Lengths+stringsLength;
    } else {
        // Store span lengths for only one span() variant.
        if(which&UTF8) {
            spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
            utf8=spanLengths+stringsLength;
        } else {
            spanLengths=(uint8_t *)utf8Lengths;
        }
        spanBackLengths=spanUTF8Lengths=spanBackUTF8Lengths=spanLengths;
    }

    // Set the meta data and pSpanNotSet and write the UTF-8 strings.
    int32_t utf8Count=0;  // Count UTF-8 bytes written so far.

    for(i=0; i<stringsLength; ++i) {
        const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
        const UChar *s16=string.getBuffer();
        int32_t length16=string.length();
        spanLength=spanSet.span(s16, length16, USET_SPAN_CONTAINED);
        if(spanLength<length16) {  // Relevant string.
            if(which&UTF16) {
                if(which&CONTAINED) {
                    if(which&FWD) {
                        spanLengths[i]=makeSpanLengthByte(spanLength);
                    }
                    if(which&BACK) {
                        spanLength=length16-spanSet.spanBack(s16, length16, USET_SPAN_CONTAINED);
                        spanBackLengths[i]=makeSpanLengthByte(spanLength);
                    }
                } else /* not CONTAINED, not all, but NOT_CONTAINED */ {
                    spanLengths[i]=spanBackLengths[i]=0;  // Only store a relevant/irrelevant flag.
                }
            }
            if(which&UTF8) {
                uint8_t *s8=utf8+utf8Count;
                int32_t length8=appendUTF8(s16, length16, s8, utf8Length-utf8Count);
                utf8Count+=utf8Lengths[i]=length8;
                if(length8==0) {  // Irrelevant for UTF-8 because not representable in UTF-8.
                    spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=(uint8_t)ALL_CP_CONTAINED;
                } else {  // Relevant for UTF-8.
                    if(which&CONTAINED) {
                        if(which&FWD) {
                            spanLength=spanSet.spanUTF8((const char *)s8, length8, USET_SPAN_CONTAINED);
                            spanUTF8Lengths[i]=makeSpanLengthByte(spanLength);
                        }
                        if(which&BACK) {
                            spanLength=length8-spanSet.spanBackUTF8((const char *)s8, length8, USET_SPAN_CONTAINED);
                            spanBackUTF8Lengths[i]=makeSpanLengthByte(spanLength);
                        }
                    } else /* not CONTAINED, not all, but NOT_CONTAINED */ {
                        spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=0;  // Only store a relevant/irrelevant flag.
                    }
                }
            }
            if(which&NOT_CONTAINED) {
                // Add string start and end code points to the spanNotSet so that
                // a span(while not contained) stops before any string.
                UChar32 c;
                if(which&FWD) {
                    int32_t len=0;
                    U16_NEXT(s16, len, length16, c);
                    addToSpanNotSet(c);
                }
                if(which&BACK) {
                    int32_t len=length16;
                    U16_PREV(s16, 0, len, c);
                    addToSpanNotSet(c);
                }
            }
        } else {  // Irrelevant string.
            if(which&UTF8) {
                if(which&CONTAINED) {  // Only necessary for LONGEST_MATCH.
                    uint8_t *s8=utf8+utf8Count;
                    int32_t length8=appendUTF8(s16, length16, s8, utf8Length-utf8Count);
                    utf8Count+=utf8Lengths[i]=length8;
                } else {
                    utf8Lengths[i]=0;
                }
            }
            if(all) {
                spanLengths[i]=spanBackLengths[i]=
                    spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=
                        (uint8_t)ALL_CP_CONTAINED;
            } else {
                // All spanXYZLengths pointers contain the same address.
                spanLengths[i]=(uint8_t)ALL_CP_CONTAINED;
            }
        }
    }

    // Finish.
    if(all) {
        pSpanNotSet->freeze();
    }
}